

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O2

void vrna_exp_params_rescale(vrna_fold_compound_t *vc,double *mfe)

{
  vrna_mx_pf_t *pvVar1;
  FLT_OR_DBL *pFVar2;
  int iVar3;
  vrna_exp_param_t *pvVar4;
  FLT_OR_DBL *pFVar5;
  vrna_md_t *md_from;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  if (vc == (vrna_fold_compound_t *)0x0) {
    return;
  }
  pvVar4 = vc->exp_params;
  if (pvVar4 == (vrna_exp_param_t *)0x0) {
    if (vc->type == VRNA_FC_TYPE_COMPARATIVE) {
      pvVar4 = vrna_exp_params_comparative((vc->field_23).field_1.n_seq,&vc->params->model_details);
    }
    else {
      if (vc->type != VRNA_FC_TYPE_SINGLE) {
        return;
      }
      pvVar4 = vrna_exp_params(&vc->params->model_details);
    }
    vc->exp_params = pvVar4;
LAB_0011e40e:
    if (pvVar4 == (vrna_exp_param_t *)0x0) {
      return;
    }
  }
  else {
    md_from = &vc->params->model_details;
    iVar3 = bcmp(md_from,&pvVar4->model_details,0x7e8);
    if (iVar3 != 0) {
      vrna_md_copy(&pvVar4->model_details,md_from);
      pvVar4 = vc->exp_params;
      goto LAB_0011e40e;
    }
  }
  dVar7 = pvVar4->kT;
  if (vc->type == VRNA_FC_TYPE_COMPARATIVE) {
    dVar7 = dVar7 / (double)(vc->field_23).field_1.n_seq;
  }
  if (mfe == (double *)0x0) {
    dVar8 = pvVar4->pf_scale;
    if (1.0 <= dVar8) goto LAB_0011e4b3;
    dVar8 = (pvVar4->temperature + -37.0) * 7.27 + -185.0;
  }
  else {
    dVar8 = (*mfe * 1000.0) / (double)vc->length;
  }
  dVar8 = exp((-(pvVar4->model_details).sfact * dVar8) / dVar7);
  pvVar4->pf_scale = dVar8;
LAB_0011e4b3:
  if (dVar8 < 1.0) {
    pvVar4->pf_scale = 1.0;
  }
  pvVar1 = vc->exp_matrices;
  pvVar4 = vc->exp_params;
  if (pvVar4 != (vrna_exp_param_t *)0x0 && pvVar1 != (vrna_mx_pf_t *)0x0) {
    pFVar5 = pvVar1->scale;
    *pFVar5 = 1.0;
    pFVar5[1] = 1.0 / pvVar4->pf_scale;
    pFVar2 = pvVar1->expMLbase;
    *pFVar2 = 1.0;
    pFVar2[1] = pvVar4->expMLbase / pvVar4->pf_scale;
    for (uVar6 = 2; uVar6 <= vc->length; uVar6 = uVar6 + 1) {
      pFVar5[uVar6] =
           pFVar5[uVar6 >> 1 & 0x7fffffff] *
           pFVar5[(int)((int)uVar6 - ((uint)(uVar6 >> 1) & 0x7fffffff))];
      dVar7 = pow(pvVar4->expMLbase,(double)(int)uVar6);
      pFVar5 = pvVar1->scale;
      pvVar1->expMLbase[uVar6] = dVar7 * pFVar5[uVar6];
    }
  }
  return;
}

Assistant:

PUBLIC void
vrna_exp_params_rescale(vrna_fold_compound_t  *vc,
                        double                *mfe)
{
  vrna_exp_param_t  *pf;
  double            e_per_nt, kT;
  vrna_md_t         *md;

  if (vc) {
    if (!vc->exp_params) {
      switch (vc->type) {
        case VRNA_FC_TYPE_SINGLE:
          vc->exp_params = vrna_exp_params(&(vc->params->model_details));
          break;
        case VRNA_FC_TYPE_COMPARATIVE:
          vc->exp_params = vrna_exp_params_comparative(vc->n_seq, &(vc->params->model_details));
          break;
      }
    } else if (memcmp(&(vc->params->model_details),
                      &(vc->exp_params->model_details),
                      sizeof(vrna_md_t)) != 0) {
      /* make sure that model details are matching */
      (void)vrna_md_copy(&(vc->exp_params->model_details), &(vc->params->model_details));
      /* we probably need some mechanism to check whether DP matrices still match the new model settings! */
    }

    pf = vc->exp_params;
    if (pf) {
      kT  = pf->kT;
      md  = &(pf->model_details);

      if (vc->type == VRNA_FC_TYPE_COMPARATIVE)
        kT /= vc->n_seq;

      /* re-compute scaling factor if necessary */
      if ((mfe) || (pf->pf_scale < 1.)) {
        if (mfe)  /* use largest known Boltzmann factor for scaling */
          e_per_nt = *mfe * 1000. / vc->length;
        else      /* use mean energy for random sequences: 184.3*length cal for scaling */
          e_per_nt = -185 + (pf->temperature - 37.) * 7.27;

        /* apply user-defined scaling factor to allow scaling for unusually stable/unstable structure enembles */
        pf->pf_scale = exp(-(md->sfact * e_per_nt) / kT);
      }

      if (pf->pf_scale < 1.)
        pf->pf_scale = 1.;

      rescale_params(vc);
    }
  }
}